

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O1

REF_STATUS ref_geom_create(REF_GEOM *ref_geom_ptr)

{
  uint uVar1;
  REF_GEOM ref_geom;
  REF_INT *pRVar2;
  REF_DBL *pRVar3;
  undefined8 uVar4;
  char *pcVar5;
  
  *ref_geom_ptr = (REF_GEOM)0x0;
  ref_geom = (REF_GEOM)malloc(0xf0);
  *ref_geom_ptr = ref_geom;
  if (ref_geom == (REF_GEOM)0x0) {
    pcVar5 = "malloc *ref_geom_ptr of REF_GEOM_STRUCT NULL";
    uVar4 = 0x40;
  }
  else {
    ref_geom->max = 10;
    pRVar2 = (REF_INT *)malloc(0xf0);
    ref_geom->descr = pRVar2;
    if (pRVar2 == (REF_INT *)0x0) {
      pcVar5 = "malloc ref_geom->descr of REF_INT NULL";
      uVar4 = 0x47;
    }
    else {
      pRVar3 = (REF_DBL *)malloc(0xa0);
      ref_geom->param = pRVar3;
      if (pRVar3 != (REF_DBL *)0x0) {
        ref_geom->ref_adj = (REF_ADJ)0x0;
        uVar1 = ref_geom_initialize(ref_geom);
        if (uVar1 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                 0x4a,"ref_geom_create",(ulong)uVar1,"init geom list");
          return uVar1;
        }
        ref_geom->face_min_length = (REF_DBL *)0x0;
        ref_geom->face_seg_per_rad = (REF_DBL *)0x0;
        ref_geom->uv_area_sign = (REF_DBL *)0x0;
        ref_geom->initial_cell_height = (REF_DBL *)0x0;
        ref_geom->segments_per_radian_of_curvature = 2.0;
        ref_geom->segments_per_bounding_box_diagonal = 10.0;
        ref_geom->tolerance_protection = 100.0;
        ref_geom->gap_protection = 10.0;
        ref_geom->nnode = -1;
        ref_geom->nedge = -1;
        ref_geom->nface = -1;
        ref_geom->zip_pcurve = 0;
        ref_geom->effective = 0;
        ref_geom->effective_curvature = 1;
        ref_geom->manifold = 1;
        ref_geom->contex_owned = 1;
        ref_geom->context = (void *)0x0;
        uVar1 = ref_egads_open(ref_geom);
        if (uVar1 == 0) {
          ref_geom->meshlink_projection = (void *)0x0;
          ref_geom->ref_facelift = (REF_FACELIFT)0x0;
          ref_geom->cad_data = (REF_BYTE *)0x0;
          ref_geom->meshlink = (void *)0x0;
          ref_geom->e2f = (REF_INT *)0x0;
          ref_geom->cad_data_size = 0;
          ref_geom->nodes = (void *)0x0;
          ref_geom->pcurves = (void **)0x0;
          ref_geom->faces = (void *)0x0;
          ref_geom->edges = (void *)0x0;
          ref_geom->model = (void *)0x0;
          ref_geom->body = (void *)0x0;
          return 0;
        }
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x5e
               ,"ref_geom_create",(ulong)uVar1,"open egads");
        return uVar1;
      }
      pcVar5 = "malloc ref_geom->param of REF_DBL NULL";
      uVar4 = 0x48;
    }
  }
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",uVar4,
         "ref_geom_create",pcVar5);
  return 2;
}

Assistant:

REF_FCN REF_STATUS ref_geom_create(REF_GEOM *ref_geom_ptr) {
  REF_GEOM ref_geom;

  (*ref_geom_ptr) = NULL;

  ref_malloc(*ref_geom_ptr, 1, REF_GEOM_STRUCT);

  ref_geom = (*ref_geom_ptr);

  ref_geom_max(ref_geom) = 10;

  ref_malloc(ref_geom->descr, REF_GEOM_DESCR_SIZE * ref_geom_max(ref_geom),
             REF_INT);
  ref_malloc(ref_geom->param, 2 * ref_geom_max(ref_geom), REF_DBL);
  ref_geom->ref_adj = (REF_ADJ)NULL;
  RSS(ref_geom_initialize(ref_geom), "init geom list");

  ref_geom->uv_area_sign = NULL;
  ref_geom->initial_cell_height = NULL;
  ref_geom->face_min_length = NULL;
  ref_geom->face_seg_per_rad = NULL;
  ref_geom->segments_per_radian_of_curvature = 2.0;
  ref_geom->segments_per_bounding_box_diagonal = 10.0;
  ref_geom->tolerance_protection = 100.0;
  ref_geom->gap_protection = 10.0;

  ref_geom->nnode = REF_EMPTY;
  ref_geom->nedge = REF_EMPTY;
  ref_geom->nface = REF_EMPTY;
  ref_geom->zip_pcurve = REF_FALSE;
  ref_geom->effective = REF_FALSE;
  ref_geom->effective_curvature = REF_TRUE;
  ref_geom->manifold = REF_TRUE;
  ref_geom->contex_owned = REF_TRUE;
  ref_geom->context = NULL;
  RSS(ref_egads_open(ref_geom), "open egads");
  ref_geom->model = NULL;
  ref_geom->body = NULL;
  ref_geom->faces = NULL;
  ref_geom->edges = NULL;
  ref_geom->nodes = NULL;
  ref_geom->pcurves = NULL;
  ref_geom->e2f = NULL;

  ref_geom->cad_data_size = 0;
  ref_geom->cad_data = (REF_BYTE *)NULL;

  ref_geom->meshlink = NULL;
  ref_geom->meshlink_projection = NULL;

  ref_geom->ref_facelift = NULL;

  return REF_SUCCESS;
}